

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *fs;
  Dyndata *pDVar4;
  Instruction *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint first;
  LocVar *pLVar11;
  TString *pTVar12;
  long lVar13;
  long lVar14;
  Labeldesc *pLVar15;
  long lVar16;
  char *pcVar17;
  FuncState *pFVar18;
  Labellist *l;
  expdesc v;
  int escapelist;
  FuncState *local_58;
  int local_4c;
  expdesc v_1;
  
  iVar9 = ls->linenumber;
  enterlevel(ls);
  iVar8 = (ls->t).token;
  switch(iVar8) {
  case 0x102:
  case 0x10a:
    iVar9 = luaK_jump(ls->fs);
    gotostat(ls,iVar9);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar9);
    break;
  case 0x108:
    pFVar18 = ls->fs;
    v_1.t = CONCAT13(v_1.t._3_1_,0x10000);
    pDVar4 = pFVar18->ls->dyd;
    v_1.u.info = (pDVar4->label).n;
    v_1.u.ival._4_4_ = (pDVar4->gt).n;
    v_1.t._0_2_ = CONCAT11(0,pFVar18->nactvar);
    v_1._0_8_ = pFVar18->bl;
    pFVar18->bl = (BlockCnt *)&v_1;
    luaX_next(ls);
    pTVar12 = str_checkname(ls);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x2c) || (iVar8 == 0x10c)) {
      local_58 = ls->fs;
      bVar2 = local_58->freereg;
      new_localvarliteral_(ls,"(for generator)",0xf);
      new_localvarliteral_(ls,"(for state)",0xb);
      new_localvarliteral_(ls,"(for control)",0xd);
      new_localvar(ls,pTVar12);
      iVar8 = 1;
      while (iVar6 = testnext(ls,0x2c), iVar6 != 0) {
        pTVar12 = str_checkname(ls);
        new_localvar(ls,pTVar12);
        iVar8 = iVar8 + 1;
      }
      checknext(ls,0x10c);
      local_4c = ls->linenumber;
      iVar6 = explist(ls,&v);
      adjust_assign(ls,3,iVar6,&v);
      luaK_checkstack(local_58,3);
      iVar7 = 0;
      iVar6 = local_4c;
    }
    else {
      if (iVar8 != 0x3d) {
        pcVar17 = "\'=\' or \'in\' expected";
        goto LAB_001123bc;
      }
      fs = ls->fs;
      bVar2 = fs->freereg;
      new_localvarliteral_(ls,"(for index)",0xb);
      new_localvarliteral_(ls,"(for limit)",0xb);
      new_localvarliteral_(ls,"(for step)",10);
      new_localvar(ls,pTVar12);
      checknext(ls,0x3d);
      exp1(ls);
      checknext(ls,0x2c);
      exp1(ls);
      iVar8 = testnext(ls,0x2c);
      if (iVar8 == 0) {
        bVar3 = fs->freereg;
        iVar8 = luaK_intK(fs,1);
        luaK_codek(fs,(uint)bVar3,iVar8);
        luaK_reserveregs(fs,1);
      }
      else {
        exp1(ls);
      }
      iVar8 = 1;
      iVar6 = iVar9;
      iVar7 = iVar8;
    }
    forbody(ls,(uint)bVar2,iVar6,iVar8,iVar7);
    check_match(ls,0x106,0x108,iVar9);
    goto LAB_00112351;
  case 0x109:
    luaX_next(ls);
    singlevar(ls,&v);
    while (iVar8 = (ls->t).token, iVar8 == 0x2e) {
      fieldsel(ls,&v);
    }
    if (iVar8 == 0x3a) {
      fieldsel(ls,&v);
    }
    body(ls,&v_1,(uint)(iVar8 == 0x3a),iVar9);
    luaK_storevar(ls->fs,&v,&v_1);
    luaK_fixline(ls->fs,iVar9);
    break;
  case 0x10b:
    local_58 = ls->fs;
    escapelist = -1;
    do {
      pFVar18 = ls->fs;
      luaX_next(ls);
      expr(ls,&v_1);
      checknext(ls,0x113);
      if (((ls->t).token | 8U) == 0x10a) {
        luaK_goiffalse(ls->fs,&v_1);
        uVar10 = (uint)v.t >> 0x10;
        pDVar4 = pFVar18->ls->dyd;
        v.u.info = (pDVar4->label).n;
        v.u.ival._4_4_ = (pDVar4->gt).n;
        v.t._0_2_ = CONCAT11(0,pFVar18->nactvar);
        v.t = CONCAT22((short)uVar10,(ushort)v.t) & 0xff00ffff;
        v._0_8_ = pFVar18->bl;
        pFVar18->bl = (BlockCnt *)&v;
        gotostat(ls,v_1.t);
        skipnoopstat(ls);
        uVar10 = (ls->t).token - 0x104;
        if ((0x1d < uVar10) || ((0x20000007U >> (uVar10 & 0x1f) & 1) == 0)) {
          iVar8 = luaK_jump(pFVar18);
          goto LAB_00111ce2;
        }
        leaveblock(pFVar18);
      }
      else {
        luaK_goiftrue(ls->fs,&v_1);
        uVar10 = (uint)v.t >> 0x10;
        pDVar4 = pFVar18->ls->dyd;
        v.u.info = (pDVar4->label).n;
        v.u.ival._4_4_ = (pDVar4->gt).n;
        v.t._0_2_ = CONCAT11(0,pFVar18->nactvar);
        v.t = CONCAT22((short)uVar10,(ushort)v.t) & 0xff00ffff;
        v._0_8_ = pFVar18->bl;
        pFVar18->bl = (BlockCnt *)&v;
        iVar8 = v_1.f;
LAB_00111ce2:
        statlist(ls);
        leaveblock(pFVar18);
        if (((ls->t).token & 0xfffffffeU) == 0x104) {
          iVar6 = luaK_jump(pFVar18);
          luaK_concat(pFVar18,&escapelist,iVar6);
        }
        luaK_patchtohere(pFVar18,iVar8);
      }
    } while ((ls->t).token == 0x105);
    iVar8 = testnext(ls,0x104);
    if (iVar8 != 0) {
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar9);
    pFVar18 = local_58;
    iVar8 = escapelist;
    goto LAB_00111fd3;
  case 0x10d:
    luaX_next(ls);
    iVar9 = testnext(ls,0x109);
    if (iVar9 == 0) {
      iVar9 = 0;
      do {
        pTVar12 = str_checkname(ls);
        new_localvar(ls,pTVar12);
        iVar9 = iVar9 + 1;
        iVar8 = testnext(ls,0x2c);
      } while (iVar8 != 0);
      iVar8 = testnext(ls,0x3d);
      if (iVar8 == 0) {
        v._0_8_ = v._0_8_ & 0xffffffff00000000;
        iVar8 = 0;
      }
      else {
        iVar8 = explist(ls,&v);
      }
      adjust_assign(ls,iVar9,iVar8,&v);
      adjustlocalvars(ls,iVar9);
    }
    else {
      pFVar18 = ls->fs;
      pTVar12 = str_checkname(ls);
      new_localvar(ls,pTVar12);
      adjustlocalvars(ls,1);
      body(ls,&v,0,ls->linenumber);
      iVar9 = pFVar18->pc;
      pLVar11 = getlocvar(pFVar18,v.u.info);
      pLVar11->startpc = iVar9;
    }
    break;
  case 0x111:
    pFVar18 = ls->fs;
    iVar8 = luaK_getlabel(pFVar18);
    v_1._0_8_ = &v;
    v.t = CONCAT13(v.t._3_1_,0x10000);
    pDVar4 = pFVar18->ls->dyd;
    v.u.info = (pDVar4->label).n;
    v.u.ival._4_4_ = (pDVar4->gt).n;
    v.t._0_2_ = CONCAT11(0,pFVar18->nactvar);
    v._0_8_ = pFVar18->bl;
    v_1.t._0_3_ = CONCAT21(0,pFVar18->nactvar);
    pFVar18->bl = (BlockCnt *)&v_1;
    v_1.u.info = v.u.info;
    v_1.u.ival._4_4_ = v.u.ival._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x115,0x111,iVar9);
    iVar9 = cond(ls);
    if (v_1.t._1_1_ != '\0') {
      luaK_patchclose(pFVar18,iVar9,v_1.t & 0xff);
    }
    leaveblock(pFVar18);
    luaK_patchlist(pFVar18,iVar9,iVar8);
LAB_00112351:
    leaveblock(pFVar18);
    break;
  case 0x112:
    luaX_next(ls);
    pFVar18 = ls->fs;
    iVar9 = (ls->t).token;
    first = 0;
    uVar10 = iVar9 - 0x104;
    if ((uVar10 < 0x1e) && ((0x20020007U >> (uVar10 & 0x1f) & 1) != 0)) {
      first = 0;
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      if (iVar9 != 0x3b) {
        iVar8 = explist(ls,&v);
        if (v.k - VCALL < 2) {
          luaK_setreturns(pFVar18,&v,-1);
          if (iVar8 == 1 && v.k == VCALL) {
            pIVar5 = pFVar18->f->code;
            pIVar5[v.u.info] = pIVar5[v.u.info] & 0xffffffc0 | 0x25;
          }
          first = (uint)pFVar18->nactvar;
          iVar8 = -1;
        }
        else if (iVar8 == 1) {
          first = luaK_exp2anyreg(pFVar18,&v);
          iVar8 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar18,&v);
          first = (uint)pFVar18->nactvar;
        }
      }
    }
    luaK_ret(pFVar18,first,iVar8);
    testnext(ls,0x3b);
    break;
  case 0x116:
    pFVar18 = ls->fs;
    luaX_next(ls);
    iVar6 = luaK_getlabel(pFVar18);
    iVar8 = cond(ls);
    v.t = CONCAT13(v.t._3_1_,0x10000);
    pDVar4 = pFVar18->ls->dyd;
    v.u.info = (pDVar4->label).n;
    v.u.ival._4_4_ = (pDVar4->gt).n;
    v.t._0_2_ = CONCAT11(0,pFVar18->nactvar);
    v._0_8_ = pFVar18->bl;
    pFVar18->bl = (BlockCnt *)&v;
    checknext(ls,0x103);
    block(ls);
    iVar7 = luaK_jump(pFVar18);
    luaK_patchlist(pFVar18,iVar7,iVar6);
    check_match(ls,0x106,0x116,iVar9);
    leaveblock(pFVar18);
LAB_00111fd3:
    luaK_patchtohere(pFVar18,iVar8);
    break;
  default:
    if (iVar8 == 0x120) {
      luaX_next(ls);
      pTVar12 = str_checkname(ls);
      pFVar18 = ls->fs;
      lVar13 = (long)pFVar18->bl->firstlabel;
      l = &ls->dyd->label;
      lVar14 = lVar13 + -1;
      lVar13 = lVar13 * 0x18;
      while (lVar16 = lVar13, lVar14 = lVar14 + 1, lVar14 < (ls->dyd->label).n) {
        lVar13 = lVar16 + 0x18;
        if (*(TString **)((long)&l->arr->name + lVar16) == pTVar12) {
          pcVar17 = luaO_pushfstring(pFVar18->ls->L,"label \'%s\' already defined on line %d",
                                     pTVar12 + 1,(ulong)*(uint *)((long)&l->arr->line + lVar16));
          semerror(pFVar18->ls,pcVar17);
        }
      }
      checknext(ls,0x120);
      iVar8 = luaK_getlabel(pFVar18);
      iVar9 = newlabelentry(ls,l,pTVar12,iVar9,iVar8);
      skipnoopstat(ls);
      uVar10 = (ls->t).token - 0x104;
      if ((uVar10 < 0x1e) && ((0x20000007U >> (uVar10 & 0x1f) & 1) != 0)) {
        pLVar15 = l->arr;
        pLVar15[iVar9].nactvar = pFVar18->bl->nactvar;
      }
      else {
        pLVar15 = l->arr;
      }
      findgotos(ls,pLVar15 + iVar9);
      break;
    }
    if (iVar8 == 0x3b) {
      luaX_next(ls);
      break;
    }
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x113:
  case 0x114:
  case 0x115:
    pFVar18 = ls->fs;
    suffixedexp(ls,(expdesc *)&v.u.ind);
    iVar9 = (ls->t).token;
    if ((iVar9 == 0x3d) || (iVar9 == 0x2c)) {
      v.k = VVOID;
      v._4_4_ = 0;
      assignment(ls,(LHS_assign *)&v,1);
    }
    else {
      if (v.u.info != 0xd) {
        pcVar17 = "syntax error";
LAB_001123bc:
        luaX_syntaxerror(ls,pcVar17);
      }
      pIVar5 = pFVar18->f->code;
      pIVar5[v.t] = pIVar5[v.t] & 0xff803fff | 0x4000;
    }
  }
  ls->fs->freereg = ls->fs->nactvar;
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

static void statement(LexState *ls) {
    int line = ls->linenumber;  /* may be needed for error messages */
    enterlevel(ls);
    switch (ls->t.token) {
        case ';': {  /* stat -> ';' (empty statement) */
            luaX_next(ls);  /* skip ';' */
            break;
        }
        case TK_IF: {  /* stat -> ifstat */
            ifstat(ls, line);
            break;
        }
        case TK_WHILE: {  /* stat -> whilestat */
            whilestat(ls, line);
            break;
        }
        case TK_DO: {  /* stat -> DO block END */
            luaX_next(ls);  /* skip DO */
            block(ls);
            check_match(ls, TK_END, TK_DO, line);
            break;
        }
        case TK_FOR: {  /* stat -> forstat */
            forstat(ls, line);
            break;
        }
        case TK_REPEAT: {  /* stat -> repeatstat */
            repeatstat(ls, line);
            break;
        }
        case TK_FUNCTION: {  /* stat -> funcstat */
            funcstat(ls, line);
            break;
        }
        case TK_LOCAL: {  /* stat -> localstat */
            luaX_next(ls);  /* skip LOCAL */
            if (testnext(ls, TK_FUNCTION))  /* local function? */
                localfunc(ls);
            else
                localstat(ls);
            break;
        }
        case TK_DBCOLON: {  /* stat -> label */
            luaX_next(ls);  /* skip double colon */
            labelstat(ls, str_checkname(ls), line);
            break;
        }
        case TK_RETURN: {  /* stat -> retstat */
            luaX_next(ls);  /* skip RETURN */
            retstat(ls);
            break;
        }
        case TK_BREAK:   /* stat -> breakstat */
        case TK_GOTO: {  /* stat -> 'goto' NAME */
            gotostat(ls, luaK_jump(ls->fs));
            break;
        }
        default: {  /* stat -> func | assignment */
            exprstat(ls);
            break;
        }
    }
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
    leavelevel(ls);
}